

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
__thiscall
google::protobuf::compiler::cpp::anon_unknown_3::Map::MakeVars
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,Map *this)

{
  Map *this_local;
  
  Vars(__return_storage_ptr__,(this->super_FieldGeneratorBase).field_,this->opts_,
       (bool)(this->lite_ & 1));
  return __return_storage_ptr__;
}

Assistant:

std::vector<Sub> MakeVars() const override {
    return Vars(field_, *opts_, lite_);
  }